

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgSimpleEnumeration(Abc_TgMan_t *pMan)

{
  uint uVar1;
  int iVar2;
  bool local_81;
  bool local_6d;
  uint local_6c;
  int iStack_68;
  int fChanges;
  int pGid [16];
  int local_1c;
  int local_18;
  int k;
  int j;
  int i;
  Abc_TgMan_t *pMan_local;
  
  local_1c = 0;
  for (local_18 = 0; local_18 < pMan->nGroups; local_18 = local_18 + 1) {
    for (k = 0; k < pMan->pGroup[local_18].nGVars; k = k + 1) {
      (&iStack_68)[local_1c] = local_18;
      local_1c = local_1c + 1;
    }
  }
  if (local_1c != pMan->nGVars) {
    __assert_fail("k == pMan->nGVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x866,"void Abc_TgSimpleEnumeration(Abc_TgMan_t *)");
  }
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    local_6c = 0;
    for (k = pMan->nGVars + -2; -1 < k; k = k + -1) {
      if ((&iStack_68)[k] == (&iStack_68)[k + 1]) {
        local_6d = true;
        if ((&iStack_68)[k] < 1) {
          local_6d = pMan->fPhased != 0;
        }
        uVar1 = Abc_TgSymGroupPerm(pMan,k,(uint)local_6d);
        local_6c = uVar1 | local_6c;
      }
    }
    for (k = 1; k < pMan->nGVars + -1; k = k + 1) {
      if ((&iStack_68)[k] == (&iStack_68)[k + 1]) {
        local_81 = true;
        if ((&iStack_68)[k] < 1) {
          local_81 = pMan->fPhased != 0;
        }
        uVar1 = Abc_TgSymGroupPerm(pMan,k,(uint)local_81);
        local_6c = uVar1 | local_6c;
      }
    }
    k = pMan->nVars;
    while (k = k + -1, -1 < k) {
      if (pMan->symPhase[k] != '\0') {
        uVar1 = Abc_TgPermPhase(pMan,k);
        local_6c = uVar1 | local_6c;
      }
    }
    for (k = 1; k < pMan->nVars; k = k + 1) {
      if (pMan->symPhase[k] != '\0') {
        uVar1 = Abc_TgPermPhase(pMan,k);
        local_6c = uVar1 | local_6c;
      }
    }
    if (local_6c == 0) break;
  }
  iVar2 = Abc_TgCannonVerify(pMan);
  if (iVar2 == 0) {
    __assert_fail("Abc_TgCannonVerify(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x87a,"void Abc_TgSimpleEnumeration(Abc_TgMan_t *)");
  }
  return;
}

Assistant:

static void Abc_TgSimpleEnumeration(Abc_TgMan_t * pMan)
{
    int i, j, k;
    int pGid[16];

    for (k = j = 0; j < pMan->nGroups; j++)
        for (i = 0; i < pMan->pGroup[j].nGVars; i++, k++)
            pGid[k] = j;
    assert(k == pMan->nGVars);

    for (k = 0; k < 5; k++)
    {
        int fChanges = 0;
        for (i = pMan->nGVars - 2; i >= 0; i--)
            if (pGid[i] == pGid[i + 1])
                fChanges |= Abc_TgSymGroupPerm(pMan, i, pGid[i] > 0 || pMan->fPhased);
        for (i = 1; i < pMan->nGVars - 1; i++)
            if (pGid[i] == pGid[i + 1])
                fChanges |= Abc_TgSymGroupPerm(pMan, i, pGid[i] > 0 || pMan->fPhased);

        for (i = pMan->nVars - 1; i >= 0; i--)
            if (pMan->symPhase[i])
                fChanges |= Abc_TgPermPhase(pMan, i);
        for (i = 1; i < pMan->nVars; i++)
            if (pMan->symPhase[i])
                fChanges |= Abc_TgPermPhase(pMan, i);
        if (!fChanges) break;
    }
    assert(Abc_TgCannonVerify(pMan));
}